

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

OPJ_BOOL opj_tcd_dc_level_shift_encode(opj_tcd_t *p_tcd)

{
  opj_tcd_tile_t *poVar1;
  OPJ_INT32 *pOVar2;
  float *local_50;
  OPJ_INT32 *l_current_ptr;
  OPJ_SIZE_T i;
  OPJ_SIZE_T l_nb_elem;
  opj_tcd_tile_t *l_tile;
  opj_image_comp_t *l_img_comp;
  opj_tccp_t *l_tccp;
  opj_tcd_tilecomp_t *l_tile_comp;
  OPJ_UINT32 compno;
  opj_tcd_t *p_tcd_local;
  
  poVar1 = p_tcd->tcd_image->tiles;
  l_tccp = (opj_tccp_t *)poVar1->comps;
  l_img_comp = (opj_image_comp_t *)p_tcd->tcp->tccps;
  for (l_tile_comp._4_4_ = 0; l_tile_comp._4_4_ < poVar1->numcomps;
      l_tile_comp._4_4_ = l_tile_comp._4_4_ + 1) {
    local_50 = *(float **)&l_tccp->stepsizes[2].mant;
    pOVar2 = (OPJ_INT32 *)
             ((long)(int)(l_tccp->cblkw - l_tccp->csty) *
             (long)(int)(l_tccp->cblkh - l_tccp->numresolutions));
    if (l_img_comp->y0 == 1) {
      for (l_current_ptr = (OPJ_INT32 *)0x0; l_current_ptr < pOVar2;
          l_current_ptr = (OPJ_INT32 *)((long)l_current_ptr + 1)) {
        *local_50 = (float)((int)*local_50 - *(int *)((long)&l_img_comp[0x10].data + 4));
        local_50 = local_50 + 1;
      }
    }
    else {
      for (l_current_ptr = (OPJ_INT32 *)0x0; l_current_ptr < pOVar2;
          l_current_ptr = (OPJ_INT32 *)((long)l_current_ptr + 1)) {
        *local_50 = (float)((int)*local_50 - *(int *)((long)&l_img_comp[0x10].data + 4));
        local_50 = local_50 + 1;
      }
    }
    l_img_comp = (opj_image_comp_t *)&l_img_comp[0x10].alpha;
    l_tccp = (opj_tccp_t *)&l_tccp->stepsizes[10].mant;
  }
  return 1;
}

Assistant:

static OPJ_BOOL opj_tcd_dc_level_shift_encode(opj_tcd_t *p_tcd)
{
    OPJ_UINT32 compno;
    opj_tcd_tilecomp_t * l_tile_comp = 00;
    opj_tccp_t * l_tccp = 00;
    opj_image_comp_t * l_img_comp = 00;
    opj_tcd_tile_t * l_tile;
    OPJ_SIZE_T l_nb_elem, i;
    OPJ_INT32 * l_current_ptr;

    l_tile = p_tcd->tcd_image->tiles;
    l_tile_comp = l_tile->comps;
    l_tccp = p_tcd->tcp->tccps;
    l_img_comp = p_tcd->image->comps;

    for (compno = 0; compno < l_tile->numcomps; compno++) {
        l_current_ptr = l_tile_comp->data;
        l_nb_elem = (OPJ_SIZE_T)(l_tile_comp->x1 - l_tile_comp->x0) *
                    (OPJ_SIZE_T)(l_tile_comp->y1 - l_tile_comp->y0);

        if (l_tccp->qmfbid == 1) {
            for (i = 0; i < l_nb_elem; ++i) {
                *l_current_ptr -= l_tccp->m_dc_level_shift ;
                ++l_current_ptr;
            }
        } else {
            for (i = 0; i < l_nb_elem; ++i) {
                *((OPJ_FLOAT32 *) l_current_ptr) = (OPJ_FLOAT32)(*l_current_ptr -
                                                   l_tccp->m_dc_level_shift);
                ++l_current_ptr;
            }
        }

        ++l_img_comp;
        ++l_tccp;
        ++l_tile_comp;
    }

    return OPJ_TRUE;
}